

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O1

void cupdlp_compute_interaction_and_movement
               (CUPDLPwork *w,cupdlp_float *dMovement,cupdlp_float *dInteraction)

{
  int len;
  int iVar1;
  CUPDLPiterates *pCVar2;
  CUPDLPvec *pCVar3;
  CUPDLPvec *pCVar4;
  CUPDLPvec *pCVar5;
  CUPDLPvec *pCVar6;
  CUPDLPvec *pCVar7;
  CUPDLPvec *pCVar8;
  cupdlp_float *pcVar9;
  cupdlp_float *pcVar10;
  int i;
  int iVar11;
  long lVar12;
  int i_1;
  int iVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dres;
  double dVar17;
  double local_70;
  
  pCVar2 = w->iterates;
  len = w->problem->nCols;
  lVar15 = (long)len;
  iVar1 = w->problem->nRows;
  lVar14 = (long)iVar1;
  dVar16 = w->stepsize->dBeta;
  local_70 = 0.0;
  if (dVar16 < 0.0) {
    dVar16 = sqrt(dVar16);
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  iVar11 = w->timers->nIter;
  iVar13 = (iVar11 - ((iVar11 - (iVar11 + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 1;
  iVar11 = iVar11 % 2;
  pCVar3 = pCVar2->x[iVar11];
  pCVar4 = pCVar2->y[iVar11];
  pCVar5 = pCVar2->aty[iVar11];
  pCVar6 = pCVar2->x[iVar13];
  pCVar7 = pCVar2->y[iVar13];
  pCVar8 = pCVar2->aty[iVar13];
  pcVar9 = pCVar6->data;
  memcpy(w->buffer2,pCVar3->data,lVar15 * 8);
  pcVar10 = w->buffer2;
  if (0 < len) {
    lVar12 = 0;
    do {
      pcVar10[lVar12] = pcVar10[lVar12] - pcVar9[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar15 != lVar12);
    local_70 = 0.0;
    lVar12 = 0;
    do {
      local_70 = local_70 + pcVar10[lVar12] * pcVar10[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar15 != lVar12);
    local_70 = local_70 * 0.5;
  }
  pcVar9 = pCVar7->data;
  memcpy(pcVar10,pCVar4->data,lVar14 * 8);
  if (iVar1 < 1) {
    dVar17 = 0.0;
  }
  else {
    pcVar10 = w->buffer2;
    lVar15 = 0;
    do {
      pcVar10[lVar15] = pcVar10[lVar15] - pcVar9[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar14 != lVar15);
    dVar17 = 0.0;
    lVar15 = 0;
    do {
      dVar17 = dVar17 + pcVar10[lVar15] * pcVar10[lVar15];
      lVar15 = lVar15 + 1;
    } while (lVar14 != lVar15);
  }
  cupdlp_diffDotDiff(w,pCVar3->data,pCVar6->data,pCVar5->data,pCVar8->data,len,dInteraction);
  *dMovement = dVar17 / (dVar16 + dVar16) + local_70 * dVar16;
  return;
}

Assistant:

void cupdlp_compute_interaction_and_movement(CUPDLPwork *w,
                                             cupdlp_float *dMovement,
                                             cupdlp_float *dInteraction) {
  CUPDLPiterates *iterates = w->iterates;
  cupdlp_int nCols = w->problem->nCols;
  cupdlp_int nRows = w->problem->nRows;
  cupdlp_float beta = sqrt(w->stepsize->dBeta);
  cupdlp_float dX = 0.0;
  cupdlp_float dY = 0.0;

  cupdlp_int iter = w->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];
  CUPDLPvec *xUpdate = iterates->x[(iter + 1) % 2];
  CUPDLPvec *yUpdate = iterates->y[(iter + 1) % 2];
  CUPDLPvec *atyUpdate = iterates->aty[(iter + 1) % 2];

#if !defined(CUPDLP_CPU) && USE_KERNELS
  cupdlp_movement_interaction_cuda(&dX, &dY, dInteraction, w->buffer2,
      xUpdate->data, x->data, yUpdate->data, y->data, atyUpdate->data, aty->data, nRows, nCols);
#else
    cupdlp_diffTwoNormSquared(w, x->data, xUpdate->data, nCols, &dX);
    cupdlp_diffTwoNormSquared(w, y->data, yUpdate->data, nRows, &dY);
    //      Δx' (AΔy)
    cupdlp_diffDotDiff(w, x->data, xUpdate->data, aty->data, atyUpdate->data,
                       nCols, dInteraction);
#endif
  *dMovement = dX * 0.5 * beta + dY / (2.0 * beta);
}